

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

xml_output *
valueTagDefX(xml_output *__return_storage_ptr__,QStringList *v,QString *tagName,char *s)

{
  char *pcVar1;
  long lVar2;
  QArrayData *pQVar3;
  storage_type *psVar4;
  char16_t *pcVar5;
  storage_type *psVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QAnyStringView QVar8;
  QByteArrayView QVar9;
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  QArrayDataPointer<QString> local_68;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (v->d).size;
  if (lVar2 == 0) {
    __return_storage_ptr__->xo_type = tNothing;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_001fe95c;
    (__return_storage_ptr__->xo_value).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->xo_value).d.size = 0;
    (__return_storage_ptr__->xo_text).d.size = 0;
    (__return_storage_ptr__->xo_value).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.ptr = (char16_t *)0x0;
  }
  else {
    local_68.d = (v->d).d;
    local_68.ptr = (v->d).ptr;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar7.m_data = (storage_type *)0x5;
    QVar7.m_size = (qsizetype)&local_48;
    local_68.size = lVar2;
    QString::fromUtf8(QVar7);
    local_88 = local_48;
    pcStack_80 = pcStack_40;
    local_78 = local_38;
    QVar8.m_size = (size_t)&local_88;
    QVar8.field_0.m_data = &local_48;
    QString::arg_impl(QVar8,(int)(tagName->d).ptr,(QChar)(char16_t)(tagName->d).size);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_68,local_68.size,(QString *)&local_48);
    QList<QString>::end((QList<QString> *)&local_68);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    if (s == (char *)0x0) {
      psVar6 = (storage_type *)0x0;
    }
    else {
      psVar4 = (storage_type *)0xffffffffffffffff;
      do {
        psVar6 = psVar4 + 1;
        pcVar1 = s + 1 + (long)psVar4;
        psVar4 = psVar6;
      } while (*pcVar1 != '\0');
    }
    QVar9.m_data = psVar6;
    QVar9.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar9);
    pQVar3 = local_48;
    pcVar5 = pcStack_40;
    if (pcStack_40 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    QtPrivate::QStringList_join((QList *)&local_48,(QChar *)&local_68,(longlong)pcVar5);
    __return_storage_ptr__->xo_type = tValueTag;
    (__return_storage_ptr__->xo_text).d.d = (Data *)local_48;
    (__return_storage_ptr__->xo_text).d.ptr = pcStack_40;
    (__return_storage_ptr__->xo_text).d.size = local_38;
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (__return_storage_ptr__->xo_value).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_value).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->xo_value).d.size = 0;
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_001fe95c:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline XmlOutput::xml_output valueTagDefX(const QStringList &v, const QString &tagName, const char *s = " ")
{
    if(v.isEmpty())
        return noxml();
    QStringList temp = v;
    temp.append(QString("%(%1)").arg(tagName));
    return valueTag(temp.join(s));
}